

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O1

err_t bign96Sign2(octet *sig,bign_params *params,octet *oid_der,size_t oid_len,octet *hash,
                 octet *privkey,void *t,size_t t_len)

{
  u64 *dest;
  word *state;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ec_o *ec;
  size_t sVar6;
  u32 *key_;
  word *b;
  uint uVar7;
  u32 *t_1;
  u64 *dest_00;
  
  bVar1 = memIsValid(params,0x150);
  eVar2 = 0x6d;
  if ((((bVar1 != 0) && (eVar2 = 0x1f6, params->l == 0x60)) &&
      (eVar2 = 0x12d, oid_len != 0xffffffffffffffff)) &&
     (sVar5 = oidFromDER((char *)0x0,oid_der,oid_len), sVar5 != 0xffffffffffffffff)) {
    if ((t != (void *)0x0) && (bVar1 = memIsValid(t,t_len), bVar1 == 0)) {
      return 0x6d;
    }
    sVar5 = bign96Start_keep(bign96Sign2_deep);
    ec = (ec_o *)blobCreate(sVar5);
    if (ec == (ec_o *)0x0) {
      eVar2 = 0x6e;
    }
    else {
      eVar2 = bign96Start(ec,params);
      if (eVar2 == 0) {
        sVar5 = ec->f->n;
        bVar1 = memIsValid(hash,0x18);
        eVar2 = 0x6d;
        if (((bVar1 != 0) && (bVar1 = memIsValid(privkey,0x18), bVar1 != 0)) &&
           ((bVar1 = memIsValid(sig,0x22), bVar1 != 0 &&
            (bVar1 = memIsDisjoint2(hash,0x18,sig,0x22), bVar1 != 0)))) {
          dest_00 = (u64 *)((long)&(ec->hdr).keep + (ec->hdr).keep);
          sVar6 = beltHash_keep();
          u64From(dest_00,privkey,0x18);
          bVar1 = wwIsZero(dest_00,sVar5);
          eVar2 = 0x1f8;
          if ((bVar1 == 0) && (iVar3 = wwCmp(dest_00,ec->order,sVar5), iVar3 < 0)) {
            dest = dest_00 + sVar5;
            b = dest + sVar5;
            state = b + sVar5 + 4;
            key_ = (u32 *)((long)b + sVar6 + sVar5 * 8 + 0x20);
            beltHashStart(state);
            beltHashStepH(oid_der,oid_len,state);
            sVar6 = beltHash_keep();
            memCopy(key_,state,sVar6);
            beltHashStepH(privkey,0x18,key_);
            if (t != (void *)0x0) {
              beltHashStepH(t,t_len,key_);
            }
            beltHashStepG((octet *)key_,key_);
            beltKeyExpand2(key_,(octet *)key_,0x20);
            memCopy(dest,hash,0x18);
            uVar7 = 1;
            while( true ) {
              u32From((u32 *)dest,dest,0x18);
              beltBlockEncr3((u32 *)(dest + 1),(u32 *)((long)dest + 0xc),(u32 *)(dest + 2),
                             (u32 *)((long)dest + 0x14),key_);
              uVar4 = (uint)dest[1] ^ uVar7;
              *(uint *)(dest + 1) = uVar4;
              *(uint *)dest = (uint)*dest ^ uVar4;
              *(uint *)((long)dest + 4) = *(uint *)((long)dest + 4) ^ *(uint *)((long)dest + 0xc);
              beltBlockEncr3((u32 *)(dest + 2),(u32 *)((long)dest + 0x14),(u32 *)dest,
                             (u32 *)((long)dest + 4),key_);
              uVar4 = uVar7 + 1 ^ (uint)dest[2];
              *(uint *)(dest + 2) = uVar4;
              *(uint *)(dest + 1) = (uint)dest[1] ^ uVar4;
              *(uint *)((long)dest + 0xc) =
                   *(uint *)((long)dest + 0xc) ^ *(uint *)((long)dest + 0x14);
              beltBlockEncr3((u32 *)dest,(u32 *)((long)dest + 4),(u32 *)(dest + 1),
                             (u32 *)((long)dest + 0xc),key_);
              uVar4 = (uint)*dest ^ uVar7 + 2;
              *(uint *)dest = uVar4;
              *(uint *)(dest + 2) = (uint)dest[2] ^ uVar4;
              *(uint *)((long)dest + 0x14) =
                   *(uint *)((long)dest + 0x14) ^ *(uint *)((long)dest + 4);
              u32To(dest,0x18,(u32 *)dest);
              u64From(dest,dest,0x18);
              bVar1 = wwIsZero(dest,sVar5);
              if ((bVar1 == 0) && (iVar3 = wwCmp(dest,ec->order,sVar5), iVar3 < 0)) break;
              u64To(dest,0x18,dest);
              uVar7 = uVar7 + 3;
            }
            bVar1 = ecMulA(b,ec->base,ec,dest,sVar5,key_);
            if (bVar1 == 0) {
              eVar2 = 0x1f6;
            }
            else {
              (*ec->f->to)((octet *)b,b,ec->f,key_);
              beltHashStepH(b,0x18,state);
              beltHashStepH(hash,0x18,state);
              beltHashStepG2(sig,10,state);
              sig[10] = '\0';
              sig[0xb] = '\0';
              sig[0xc] = 0x80;
              u64From(b + sVar5 + 2,sig,0xd);
              zzMul(b,b + sVar5 + 2,2,dest_00,sVar5,key_);
              zzMod(dest_00,b,sVar5 + 2,ec->order,sVar5,key_);
              zzSubMod(dest_00,dest,dest_00,ec->order,sVar5);
              u64From(dest,hash,0x18);
              zzSubMod(dest_00,dest_00,dest,ec->order,sVar5);
              u64To(sig + 10,0x18,dest_00);
              eVar2 = 0;
            }
          }
        }
      }
      blobClose(ec);
    }
  }
  return eVar2;
}

Assistant:

err_t bign96Sign2(octet sig[34], const bign_params* params,
	const octet oid_der[], size_t oid_len, const octet hash[24],
	const octet privkey[24], const void* t, size_t t_len)
{
	err_t code;
	size_t n;
	u32 round = 1;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* k;				/* [n] одноразовый личный ключ */
	word* R;				/* [2n] точка R */
	word* s0;				/* [W_OF_O(13)] первая часть подписи */
	word* s1;				/* [n] вторая часть подписи */
	octet* hash_state;		/* [beltHash_keep] состояние хэширования */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// проверить t
	if (!memIsNullOrValid(t, t_len))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96Sign2_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(hash, 24) ||
		!memIsValid(privkey, 24) ||
		!memIsValid(sig, 34) ||
		!memIsDisjoint2(hash, 24, sig, 34))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = s1 = objEnd(ec, word);
	k = d + n;
	R = k + n;
	s0 = R + n + W_OF_O(13);
	hash_state = (octet*)(s0 + W_OF_O(13));
	stack = hash_state + beltHash_keep();
	// загрузить d
	wwFrom(d, privkey, 24);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// хэшировать oid
	beltHashStart(hash_state);
	beltHashStepH(oid_der, oid_len, hash_state);
	// сгенерировать k по алгоритму 6.3.3
	{
		// theta <- belt-hash(oid || d || t)
		memCopy(stack, hash_state, beltHash_keep());
		beltHashStepH(privkey, 24, stack);
		if (t != 0)
			beltHashStepH(t, t_len, stack);
		beltHashStepG(stack, stack);
		beltKeyExpand2((u32*)stack, stack, 32);
		// k <- H
		memCopy(k, hash, 24);
		// k <- belt32Block(k, theta) пока k \notin {1,..., q - 1}
		while (1)
		{
			belt32BlockEncr((octet*)k, (u32*)stack, &round);
			wwFrom(k, k, 24);
			if (!wwIsZero(k, n) && wwCmp(k, ec->order, n) < 0)
				break;
			wwTo(k, 24, k);
		}
	}
	// R <- k G
	if (!ecMulA(R, ec->base, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// s0 <- belt-hash(oid || R || H) mod 2^80 + 2^l
	beltHashStepH(R, 24, hash_state);
	beltHashStepH(hash, 24, hash_state);
	beltHashStepG2(sig, 10, hash_state);
	sig[10] = sig[11] = 0, sig[12] = 0x80;
	wwFrom(s0, sig, 13);
	// R <- (s0 + 2^96) d
	zzMul(R, s0, W_OF_O(13), d, n, stack);
	// s1 <- R mod q
	zzMod(s1, R, n + W_OF_O(13), ec->order, n, stack);
	// s1 <- (k - s1 - H) mod q
	zzSubMod(s1, k, s1, ec->order, n);
	wwFrom(k, hash, 24);
	zzSubMod(s1, s1, k, ec->order, n);
	// выгрузить s1
	wwTo(sig + 10, 24, s1);
	// все нормально
	blobClose(state);
	return ERR_OK;
}